

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O1

void ncnn::pack_A_tile(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  undefined8 *puVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  size_t *psVar14;
  long lVar15;
  undefined1 (*pauVar16) [64];
  void *pvVar17;
  undefined1 (*pauVar18) [32];
  int iVar19;
  long lVar20;
  ulong uVar21;
  undefined1 (*pauVar22) [16];
  long lVar23;
  long lVar24;
  long lVar25;
  undefined1 (*pauVar26) [64];
  ulong uVar27;
  undefined8 *puVar28;
  long lVar29;
  long lVar30;
  undefined1 (*pauVar31) [16];
  int iVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  undefined1 (*pauVar42) [64];
  uint uVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  ulong uVar47;
  uint uVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  long local_168;
  long local_150;
  long local_140;
  long local_130;
  long local_118;
  long local_110;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_70;
  long local_68;
  
  psVar14 = (size_t *)&A->w;
  if (A->dims == 3) {
    psVar14 = &A->cstep;
  }
  iVar32 = A->elempack;
  pauVar42 = (undefined1 (*) [64])AT->data;
  uVar47 = 0;
  lVar35 = (long)k;
  lVar33 = (long)i;
  lVar36 = (long)(int)*psVar14;
  if (0xf < max_ii) {
    bVar6 = 0 < max_kk;
    auVar54 = vpbroadcastd_avx512vl();
    auVar55 = vpmovsxdq_avx512f(auVar54);
    lVar15 = lVar36 * lVar33;
    lVar23 = (long)(k * 8) * 4;
    lVar30 = lVar23 + lVar15 * 4;
    lVar40 = lVar36 * 0x40;
    lVar38 = (lVar33 + 8) * lVar36;
    lVar23 = lVar23 + lVar38 * 4;
    local_88 = (long)(k * 4) * 4;
    lVar51 = local_88 + lVar15 * 4;
    lVar24 = (lVar33 + 4) * lVar36;
    lVar25 = local_88 + lVar24 * 4;
    lVar38 = local_88 + lVar38 * 4;
    local_88 = local_88 + (lVar33 + 0xc) * lVar36 * 4;
    lVar39 = lVar35 * 4;
    local_d0 = lVar39 + (lVar33 + 7) * lVar36 * 4;
    local_d8 = lVar39 + (lVar33 + 6) * lVar36 * 4;
    local_90 = lVar39 + (lVar33 + 5) * lVar36 * 4;
    local_e0 = lVar39 + lVar24 * 4;
    local_98 = lVar39 + (lVar33 + 3) * lVar36 * 4;
    local_68 = lVar39 + (lVar33 + 2) * lVar36 * 4;
    local_70 = lVar39 + (lVar33 + 1) * lVar36 * 4;
    lVar15 = lVar39 + lVar15 * 4;
    auVar56 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    uVar27 = 0;
    do {
      if (iVar32 == 0x10 && bVar6) {
        pauVar16 = (undefined1 (*) [64])
                   ((long)A->data + (long)(k << 4) * 4 + (uVar27 + lVar33) * lVar36 * 4);
        iVar19 = max_kk;
        do {
          *pauVar42 = *pauVar16;
          pauVar42 = pauVar42 + 1;
          pauVar16 = pauVar16 + 1;
          iVar19 = iVar19 + -1;
        } while (iVar19 != 0);
      }
      if (iVar32 == 8 && bVar6) {
        pvVar17 = A->data;
        iVar19 = max_kk;
        do {
          puVar28 = (undefined8 *)((long)pvVar17 + lVar30);
          uVar11 = puVar28[1];
          uVar12 = puVar28[2];
          uVar13 = puVar28[3];
          *(undefined8 *)*pauVar42 = *puVar28;
          *(undefined8 *)(*pauVar42 + 8) = uVar11;
          *(undefined8 *)(*pauVar42 + 0x10) = uVar12;
          *(undefined8 *)(*pauVar42 + 0x18) = uVar13;
          *(undefined1 (*) [32])(*pauVar42 + 0x20) = *(undefined1 (*) [32])((long)pvVar17 + lVar23);
          pauVar42 = pauVar42 + 1;
          pvVar17 = (void *)((long)pvVar17 + 0x20);
          iVar19 = iVar19 + -1;
        } while (iVar19 != 0);
      }
      if (iVar32 == 4 && bVar6) {
        pvVar17 = A->data;
        lVar24 = 0;
        pauVar16 = pauVar42;
        iVar19 = max_kk;
        do {
          pauVar26 = pauVar16;
          puVar28 = (undefined8 *)((long)pvVar17 + lVar24 + lVar51);
          uVar11 = puVar28[1];
          puVar1 = (undefined8 *)(*pauVar42 + lVar24 * 4);
          *puVar1 = *puVar28;
          puVar1[1] = uVar11;
          puVar28 = (undefined8 *)((long)pvVar17 + lVar24 + lVar25);
          uVar11 = puVar28[1];
          puVar1[2] = *puVar28;
          puVar1[3] = uVar11;
          puVar28 = (undefined8 *)((long)pvVar17 + lVar24 + lVar38);
          uVar11 = puVar28[1];
          puVar1[4] = *puVar28;
          puVar1[5] = uVar11;
          *(undefined1 (*) [16])(puVar1 + 6) =
               *(undefined1 (*) [16])((long)pvVar17 + lVar24 + local_88);
          lVar24 = lVar24 + 0x10;
          iVar19 = iVar19 + -1;
          pauVar16 = (undefined1 (*) [64])(puVar1 + 8);
        } while (iVar19 != 0);
        pauVar42 = pauVar26 + 1;
      }
      if (iVar32 == 1) {
        pvVar17 = A->data;
        auVar57 = vpbroadcastq_avx512f();
        auVar57 = vpaddq_avx512f(auVar57,auVar56);
        auVar57 = vpmullq_avx512dq(auVar57,auVar55);
        lVar29 = vpextrq_avx(auVar57._0_16_,1);
        lVar44 = vpextrq_avx(auVar57._16_16_,1);
        auVar52 = vextracti32x4_avx512f(auVar57,2);
        lVar24 = vpextrq_avx(auVar52,1);
        auVar53 = vextracti32x4_avx512f(auVar57,3);
        lVar49 = vpextrq_avx(auVar53,1);
        if (max_kk < 0x10) {
          lVar46 = (long)pvVar17 + lVar35 * 4 + (uVar27 + lVar33) * lVar36 * 4;
          local_a0 = (long)pvVar17 + lVar35 * 4 + (uVar27 + lVar33 + 1) * lVar36 * 4;
          local_a8 = (long)pvVar17 + lVar35 * 4 + (lVar33 + uVar27 + 2) * lVar36 * 4;
          local_b0 = (long)pvVar17 + lVar35 * 4 + (uVar27 + lVar33 + 3) * lVar36 * 4;
          local_b8 = (long)pvVar17 + lVar35 * 4 + (uVar27 + lVar33 + 4) * lVar36 * 4;
          lVar45 = (long)pvVar17 + lVar35 * 4 + (uVar27 + lVar33 + 5) * lVar36 * 4;
          local_c0 = (long)pvVar17 + lVar35 * 4 + (uVar27 + lVar33 + 6) * lVar36 * 4;
          local_c8 = (long)pvVar17 + lVar35 * 4 + (lVar33 + uVar27 + 7) * lVar36 * 4;
          lVar37 = (long)pvVar17 + lVar35 * 4 + auVar57._0_8_ * 4;
          lVar29 = (long)pvVar17 + lVar35 * 4 + lVar29 * 4;
          lVar41 = (long)pvVar17 + lVar35 * 4 + auVar57._16_8_ * 4;
          lVar44 = (long)pvVar17 + lVar35 * 4 + lVar44 * 4;
          lVar34 = (long)pvVar17 + lVar35 * 4 + auVar52._0_8_ * 4;
          lVar24 = (long)pvVar17 + lVar35 * 4 + lVar24 * 4;
          lVar20 = (long)pvVar17 + lVar35 * 4 + auVar53._0_8_ * 4;
          lVar49 = (long)pvVar17 + lVar35 * 4 + lVar49 * 4;
          uVar43 = 0;
        }
        else {
          lVar49 = lVar39 + lVar49 * 4;
          lVar20 = lVar39 + auVar53._0_8_ * 4;
          lVar24 = lVar39 + lVar24 * 4;
          lVar34 = lVar39 + auVar52._0_8_ * 4;
          lVar44 = lVar39 + lVar44 * 4;
          lVar41 = lVar39 + auVar57._16_8_ * 4;
          lVar29 = lVar39 + lVar29 * 4;
          lVar37 = lVar39 + auVar57._0_8_ * 4;
          iVar19 = 0xf;
          do {
            lVar45 = lVar36 * 8 + lVar15;
            auVar57 = *(undefined1 (*) [64])((long)pvVar17 + lVar36 * 4 + lVar15);
            auVar60 = *(undefined1 (*) [64])((long)pvVar17 + lVar36 * 8 + lVar15);
            auVar61 = *(undefined1 (*) [64])((long)pvVar17 + lVar36 * 4 + lVar45);
            lVar46 = lVar36 * 8 + lVar45;
            auVar62 = *(undefined1 (*) [64])((long)pvVar17 + lVar36 * 8 + lVar45);
            auVar63 = *(undefined1 (*) [64])((long)pvVar17 + lVar36 * 4 + lVar46);
            lVar46 = lVar36 * 4 + lVar46;
            auVar64 = *(undefined1 (*) [64])((long)pvVar17 + lVar36 * 4 + lVar46);
            auVar65 = *(undefined1 (*) [64])((long)pvVar17 + lVar36 * 8 + lVar46);
            auVar66 = *(undefined1 (*) [64])((long)pvVar17 + lVar37);
            auVar67 = *(undefined1 (*) [64])((long)pvVar17 + lVar29);
            auVar68 = *(undefined1 (*) [64])((long)pvVar17 + lVar41);
            auVar69 = *(undefined1 (*) [64])((long)pvVar17 + lVar44);
            auVar70 = *(undefined1 (*) [64])((long)pvVar17 + lVar34);
            auVar71 = *(undefined1 (*) [64])((long)pvVar17 + lVar24);
            auVar72 = *(undefined1 (*) [64])((long)pvVar17 + lVar20);
            auVar73 = *(undefined1 (*) [64])((long)pvVar17 + lVar49);
            auVar58 = vunpcklps_avx512f(*(undefined1 (*) [64])((long)pvVar17 + lVar15),auVar57);
            auVar57 = vunpckhps_avx512f(*(undefined1 (*) [64])((long)pvVar17 + lVar15),auVar57);
            auVar59 = vunpcklps_avx512f(auVar60,auVar61);
            auVar60 = vunpckhps_avx512f(auVar60,auVar61);
            auVar61 = vunpcklps_avx512f(auVar62,auVar63);
            auVar62 = vunpckhps_avx512f(auVar62,auVar63);
            auVar63 = vunpcklps_avx512f(auVar64,auVar65);
            auVar64 = vunpckhps_avx512f(auVar64,auVar65);
            auVar65 = vunpcklps_avx512f(auVar66,auVar67);
            auVar66 = vunpckhps_avx512f(auVar66,auVar67);
            auVar67 = vunpcklps_avx512f(auVar68,auVar69);
            auVar68 = vunpckhps_avx512f(auVar68,auVar69);
            auVar69 = vunpcklps_avx512f(auVar70,auVar71);
            auVar70 = vunpckhps_avx512f(auVar70,auVar71);
            auVar71 = vunpcklps_avx512f(auVar72,auVar73);
            auVar72 = vunpckhps_avx512f(auVar72,auVar73);
            auVar73 = vunpcklpd_avx512f(auVar58,auVar59);
            auVar58 = vunpckhpd_avx512f(auVar58,auVar59);
            auVar59 = vunpcklpd_avx512f(auVar57,auVar60);
            auVar57 = vunpckhpd_avx512f(auVar57,auVar60);
            auVar60 = vunpcklpd_avx512f(auVar61,auVar63);
            auVar61 = vunpckhpd_avx512f(auVar61,auVar63);
            auVar63 = vunpcklpd_avx512f(auVar62,auVar64);
            auVar62 = vunpckhpd_avx512f(auVar62,auVar64);
            auVar64 = vunpcklpd_avx512f(auVar65,auVar67);
            auVar65 = vunpckhpd_avx512f(auVar65,auVar67);
            auVar67 = vunpcklpd_avx512f(auVar66,auVar68);
            auVar66 = vunpckhpd_avx512f(auVar66,auVar68);
            auVar68 = vunpcklpd_avx512f(auVar69,auVar71);
            auVar69 = vunpckhpd_avx512f(auVar69,auVar71);
            auVar71 = vunpcklpd_avx512f(auVar70,auVar72);
            auVar70 = vunpckhpd_avx512f(auVar70,auVar72);
            auVar72 = vshuff64x2_avx512f(auVar73,auVar60,0x88);
            auVar74 = vshuff64x2_avx512f(auVar64,auVar68,0x88);
            auVar75 = vshuff64x2_avx512f(auVar58,auVar61,0x88);
            auVar76 = vshuff64x2_avx512f(auVar65,auVar69,0x88);
            auVar77 = vshuff64x2_avx512f(auVar59,auVar63,0x88);
            auVar78 = vshuff64x2_avx512f(auVar67,auVar71,0x88);
            auVar79 = vshuff64x2_avx512f(auVar57,auVar62,0x88);
            auVar80 = vshuff64x2_avx512f(auVar66,auVar70,0x88);
            auVar60 = vshuff64x2_avx512f(auVar73,auVar60,0xdd);
            auVar64 = vshuff64x2_avx512f(auVar64,auVar68,0xdd);
            auVar61 = vshuff64x2_avx512f(auVar58,auVar61,0xdd);
            auVar65 = vshuff64x2_avx512f(auVar65,auVar69,0xdd);
            auVar63 = vshuff64x2_avx512f(auVar59,auVar63,0xdd);
            auVar67 = vshuff64x2_avx512f(auVar67,auVar71,0xdd);
            auVar57 = vshuff64x2_avx512f(auVar57,auVar62,0xdd);
            auVar62 = vshuff64x2_avx512f(auVar66,auVar70,0xdd);
            auVar66 = vshuff64x2_avx512f(auVar72,auVar74,0x88);
            auVar68 = vshuff64x2_avx512f(auVar75,auVar76,0x88);
            auVar69 = vshuff64x2_avx512f(auVar77,auVar78,0x88);
            auVar70 = vshuff64x2_avx512f(auVar79,auVar80,0x88);
            auVar71 = vshuff64x2_avx512f(auVar60,auVar64,0x88);
            auVar73 = vshuff64x2_avx512f(auVar61,auVar65,0x88);
            auVar58 = vshuff64x2_avx512f(auVar63,auVar67,0x88);
            auVar59 = vshuff64x2_avx512f(auVar57,auVar62,0x88);
            auVar72 = vshuff64x2_avx512f(auVar72,auVar74,0xdd);
            auVar74 = vshuff64x2_avx512f(auVar75,auVar76,0xdd);
            auVar75 = vshuff64x2_avx512f(auVar77,auVar78,0xdd);
            auVar76 = vshuff64x2_avx512f(auVar79,auVar80,0xdd);
            auVar60 = vshuff64x2_avx512f(auVar60,auVar64,0xdd);
            auVar61 = vshuff64x2_avx512f(auVar61,auVar65,0xdd);
            auVar63 = vshuff64x2_avx512f(auVar63,auVar67,0xdd);
            auVar57 = vshuff64x2_avx512f(auVar57,auVar62,0xdd);
            *pauVar42 = auVar66;
            pauVar42[1] = auVar68;
            pauVar42[2] = auVar69;
            pauVar42[3] = auVar70;
            pauVar42[4] = auVar71;
            pauVar42[5] = auVar73;
            pauVar42[6] = auVar58;
            pauVar42[7] = auVar59;
            pauVar42[8] = auVar72;
            pauVar42[9] = auVar74;
            pauVar42[10] = auVar75;
            pauVar42[0xb] = auVar76;
            pauVar42[0xc] = auVar60;
            pauVar42[0xd] = auVar61;
            pauVar42[0xe] = auVar63;
            pauVar42[0xf] = auVar57;
            pauVar42 = pauVar42 + 0x10;
            iVar19 = iVar19 + 0x10;
            pvVar17 = (void *)((long)pvVar17 + 0x40);
          } while (iVar19 < max_kk);
          lVar49 = lVar49 + (long)pvVar17;
          lVar20 = lVar20 + (long)pvVar17;
          lVar24 = lVar24 + (long)pvVar17;
          lVar34 = lVar34 + (long)pvVar17;
          lVar44 = lVar44 + (long)pvVar17;
          lVar41 = lVar41 + (long)pvVar17;
          lVar29 = lVar29 + (long)pvVar17;
          lVar37 = lVar37 + (long)pvVar17;
          local_c8 = local_d0 + (long)pvVar17;
          local_c0 = (long)pvVar17 + local_d8;
          lVar45 = (long)pvVar17 + local_90;
          local_b8 = (long)pvVar17 + local_e0;
          local_b0 = local_98 + (long)pvVar17;
          local_a8 = local_68 + (long)pvVar17;
          local_a0 = local_70 + (long)pvVar17;
          lVar46 = (long)pvVar17 + lVar15;
          uVar43 = max_kk & 0xfffffff0;
        }
        if ((int)uVar43 < max_kk) {
          lVar50 = 0;
          do {
            *(undefined4 *)*pauVar42 = *(undefined4 *)(lVar46 + lVar50 * 4);
            *(undefined4 *)(*pauVar42 + 4) = *(undefined4 *)(local_a0 + lVar50 * 4);
            *(undefined4 *)(*pauVar42 + 8) = *(undefined4 *)(local_a8 + lVar50 * 4);
            *(undefined4 *)(*pauVar42 + 0xc) = *(undefined4 *)(local_b0 + lVar50 * 4);
            *(undefined4 *)(*pauVar42 + 0x10) = *(undefined4 *)(local_b8 + lVar50 * 4);
            *(undefined4 *)(*pauVar42 + 0x14) = *(undefined4 *)(lVar45 + lVar50 * 4);
            *(undefined4 *)(*pauVar42 + 0x18) = *(undefined4 *)(local_c0 + lVar50 * 4);
            *(undefined4 *)(*pauVar42 + 0x1c) = *(undefined4 *)(local_c8 + lVar50 * 4);
            *(undefined4 *)(*pauVar42 + 0x20) = *(undefined4 *)(lVar37 + lVar50 * 4);
            *(undefined4 *)(*pauVar42 + 0x24) = *(undefined4 *)(lVar29 + lVar50 * 4);
            *(undefined4 *)(*pauVar42 + 0x28) = *(undefined4 *)(lVar41 + lVar50 * 4);
            *(undefined4 *)(*pauVar42 + 0x2c) = *(undefined4 *)(lVar44 + lVar50 * 4);
            *(undefined4 *)(*pauVar42 + 0x30) = *(undefined4 *)(lVar34 + lVar50 * 4);
            *(undefined4 *)(*pauVar42 + 0x34) = *(undefined4 *)(lVar24 + lVar50 * 4);
            *(undefined4 *)(*pauVar42 + 0x38) = *(undefined4 *)(lVar20 + lVar50 * 4);
            *(undefined4 *)(*pauVar42 + 0x3c) = *(undefined4 *)(lVar49 + lVar50 * 4);
            pauVar42 = pauVar42 + 1;
            lVar50 = lVar50 + 1;
          } while (max_kk - uVar43 != (int)lVar50);
        }
      }
      uVar47 = uVar27 + 0x10;
      uVar21 = uVar27 + 0x1f;
      lVar30 = lVar30 + lVar40;
      lVar23 = lVar23 + lVar40;
      lVar51 = lVar51 + lVar40;
      lVar25 = lVar25 + lVar40;
      lVar38 = lVar38 + lVar40;
      local_88 = local_88 + lVar40;
      local_d0 = local_d0 + lVar40;
      local_d8 = local_d8 + lVar40;
      local_90 = local_90 + lVar40;
      local_e0 = local_e0 + lVar40;
      local_98 = local_98 + lVar40;
      local_68 = local_68 + lVar40;
      local_70 = local_70 + lVar40;
      lVar15 = lVar15 + lVar40;
      uVar27 = uVar47;
    } while (uVar21 < (uint)max_ii);
  }
  lVar30 = (long)max_ii;
  if ((int)((uint)uVar47 | 7) < max_ii) {
    uVar27 = uVar47 & 0xffffffff;
    lVar39 = (uVar27 + 4 + lVar33) * lVar36;
    lVar51 = (long)(k * 4) * 4;
    lVar23 = lVar51 + lVar39 * 4;
    lVar15 = lVar36 * 0x20;
    lVar38 = (lVar33 + uVar27) * lVar36;
    lVar51 = lVar51 + lVar38 * 4;
    local_e8 = lVar35 * 4;
    lVar25 = local_e8 + (uVar27 + 7 + lVar33) * lVar36 * 4;
    local_168 = local_e8 + (uVar27 + 6 + lVar33) * lVar36 * 4;
    local_110 = local_e8 + (uVar27 + 5 + lVar33) * lVar36 * 4;
    local_118 = local_e8 + lVar39 * 4;
    local_130 = local_e8 + (uVar27 + 3 + lVar33) * lVar36 * 4;
    local_140 = local_e8 + (uVar27 + 2 + lVar33) * lVar36 * 4;
    local_150 = local_e8 + (uVar27 + 1 + lVar33) * lVar36 * 4;
    local_e8 = local_e8 + lVar38 * 4;
    do {
      if (iVar32 == 8 && 0 < max_kk) {
        pauVar18 = (undefined1 (*) [32])
                   ((long)A->data + (long)(k * 8) * 4 + (uVar27 + lVar33) * lVar36 * 4);
        iVar19 = max_kk;
        do {
          *(undefined1 (*) [32])*pauVar42 = *pauVar18;
          pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
          pauVar18 = pauVar18 + 1;
          iVar19 = iVar19 + -1;
        } while (iVar19 != 0);
      }
      if (iVar32 == 4 && 0 < max_kk) {
        pvVar17 = A->data;
        iVar19 = max_kk;
        do {
          uVar11 = ((undefined8 *)((long)pvVar17 + lVar51))[1];
          *(undefined8 *)*pauVar42 = *(undefined8 *)((long)pvVar17 + lVar51);
          *(undefined8 *)(*pauVar42 + 8) = uVar11;
          *(undefined1 (*) [16])(*pauVar42 + 0x10) = *(undefined1 (*) [16])((long)pvVar17 + lVar23);
          pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
          pvVar17 = (void *)((long)pvVar17 + 0x10);
          iVar19 = iVar19 + -1;
        } while (iVar19 != 0);
      }
      if (iVar32 == 1) {
        pvVar17 = A->data;
        if (max_kk < 8) {
          lVar38 = lVar35 * 4 + (uVar27 + lVar33) * lVar36 * 4;
          lVar37 = lVar35 * 4 + (lVar33 + 1 + uVar27) * lVar36 * 4;
          lVar49 = lVar35 * 4 + (lVar33 + 2 + uVar27) * lVar36 * 4;
          lVar44 = lVar35 * 4 + (lVar33 + 3 + uVar27) * lVar36 * 4;
          lVar29 = lVar35 * 4 + (lVar33 + 4 + uVar27) * lVar36 * 4;
          lVar40 = lVar35 * 4 + (lVar33 + 5 + uVar27) * lVar36 * 4;
          lVar24 = lVar35 * 4 + (lVar33 + uVar27 + 6) * lVar36 * 4;
          uVar43 = 0;
          lVar39 = lVar35 * 4 + (lVar33 + uVar27 + 7) * lVar36 * 4;
        }
        else {
          iVar19 = 7;
          lVar38 = 0;
          pauVar16 = pauVar42;
          do {
            pauVar26 = pauVar16;
            pauVar18 = (undefined1 (*) [32])(*pauVar42 + lVar38 * 8);
            lVar39 = lVar38 + local_e8;
            auVar54 = *(undefined1 (*) [32])((long)pvVar17 + lVar38 + local_e8);
            lVar24 = lVar36 * 8 + lVar39;
            auVar81 = *(undefined1 (*) [32])((long)pvVar17 + lVar36 * 4 + lVar39);
            auVar82 = *(undefined1 (*) [32])((long)pvVar17 + lVar36 * 8 + lVar39);
            auVar2 = *(undefined1 (*) [32])((long)pvVar17 + lVar36 * 4 + lVar24);
            lVar39 = lVar36 * 8 + lVar24;
            auVar3 = *(undefined1 (*) [32])((long)pvVar17 + lVar36 * 8 + lVar24);
            lVar24 = lVar36 * 4 + lVar39;
            auVar83 = *(undefined1 (*) [32])((long)pvVar17 + lVar36 * 4 + lVar39);
            auVar4 = *(undefined1 (*) [32])((long)pvVar17 + lVar36 * 4 + lVar24);
            auVar5 = *(undefined1 (*) [32])((long)pvVar17 + lVar36 * 8 + lVar24);
            auVar10 = vunpcklps_avx(auVar54,auVar81);
            auVar81 = vunpckhps_avx(auVar54,auVar81);
            auVar54 = vunpcklps_avx(auVar82,auVar2);
            auVar82 = vunpckhps_avx(auVar82,auVar2);
            auVar84 = vunpcklps_avx(auVar3,auVar83);
            auVar2 = vunpckhps_avx(auVar3,auVar83);
            auVar85 = vunpcklps_avx(auVar4,auVar5);
            auVar3 = vunpckhps_avx(auVar4,auVar5);
            auVar83 = vunpcklpd_avx(auVar10,auVar54);
            auVar54 = vunpckhpd_avx(auVar10,auVar54);
            auVar4 = vunpcklpd_avx(auVar81,auVar82);
            auVar81 = vunpckhpd_avx(auVar81,auVar82);
            auVar5 = vunpcklpd_avx(auVar84,auVar85);
            auVar82 = vunpckhpd_avx(auVar84,auVar85);
            auVar10 = vunpcklpd_avx(auVar2,auVar3);
            auVar2 = vunpckhpd_avx(auVar2,auVar3);
            auVar84._16_16_ = auVar5._0_16_;
            auVar84._0_16_ = auVar83._0_16_;
            auVar85._16_16_ = auVar82._0_16_;
            auVar85._0_16_ = auVar54._0_16_;
            auVar86._16_16_ = auVar10._0_16_;
            auVar86._0_16_ = auVar4._0_16_;
            auVar87._16_16_ = auVar2._0_16_;
            auVar87._0_16_ = auVar81._0_16_;
            auVar3 = vperm2f128_avx(auVar83,auVar5,0x31);
            auVar54 = vperm2f128_avx(auVar54,auVar82,0x31);
            auVar82 = vperm2f128_avx(auVar4,auVar10,0x31);
            auVar81 = vperm2f128_avx(auVar81,auVar2,0x31);
            *pauVar18 = auVar84;
            pauVar18[1] = auVar85;
            pauVar18[2] = auVar86;
            pauVar18[3] = auVar87;
            pauVar18[4] = auVar3;
            pauVar18[5] = auVar54;
            pauVar18[6] = auVar82;
            pauVar18[7] = auVar81;
            lVar38 = lVar38 + 0x20;
            iVar19 = iVar19 + 8;
            pauVar16 = (undefined1 (*) [64])(pauVar18 + 8);
          } while (iVar19 < max_kk);
          pauVar42 = pauVar26 + 4;
          lVar39 = lVar38 + lVar25;
          lVar24 = lVar38 + local_168;
          lVar40 = lVar38 + local_110;
          lVar29 = lVar38 + local_118;
          lVar44 = lVar38 + local_130;
          lVar49 = lVar38 + local_140;
          lVar37 = lVar38 + local_150;
          lVar38 = lVar38 + local_e8;
          uVar43 = max_kk & 0xfffffff8;
        }
        iVar19 = max_kk - uVar43;
        if (iVar19 != 0 && (int)uVar43 <= max_kk) {
          lVar45 = 0;
          lVar46 = 0;
          do {
            *(undefined4 *)(*pauVar42 + lVar46 * 8) =
                 *(undefined4 *)((long)pvVar17 + lVar46 + lVar38);
            *(undefined4 *)(*pauVar42 + lVar46 * 8 + 4) =
                 *(undefined4 *)((long)pvVar17 + lVar46 + lVar37);
            *(undefined4 *)(*pauVar42 + lVar46 * 8 + 8) =
                 *(undefined4 *)((long)pvVar17 + lVar46 + lVar49);
            *(undefined4 *)(*pauVar42 + lVar46 * 8 + 0xc) =
                 *(undefined4 *)((long)pvVar17 + lVar46 + lVar44);
            *(undefined4 *)(*pauVar42 + lVar46 * 8 + 0x10) =
                 *(undefined4 *)((long)pvVar17 + lVar46 + lVar29);
            *(undefined4 *)(*pauVar42 + lVar46 * 8 + 0x14) =
                 *(undefined4 *)((long)pvVar17 + lVar46 + lVar40);
            *(undefined4 *)(*pauVar42 + lVar46 * 8 + 0x18) =
                 *(undefined4 *)((long)pvVar17 + lVar46 + lVar24);
            *(undefined4 *)(*pauVar42 + lVar46 * 8 + 0x1c) =
                 *(undefined4 *)((long)pvVar17 + lVar46 + lVar39);
            lVar46 = lVar46 + 4;
            lVar45 = lVar45 + -0x20;
            iVar19 = iVar19 + -1;
          } while (iVar19 != 0);
          pauVar42 = (undefined1 (*) [64])((long)pauVar42 - lVar45);
        }
      }
      uVar47 = uVar27 + 8;
      lVar38 = uVar27 + 0xf;
      lVar23 = lVar23 + lVar15;
      lVar51 = lVar51 + lVar15;
      lVar25 = lVar25 + lVar15;
      local_168 = local_168 + lVar15;
      local_110 = local_110 + lVar15;
      local_118 = local_118 + lVar15;
      local_130 = local_130 + lVar15;
      local_140 = local_140 + lVar15;
      local_150 = local_150 + lVar15;
      local_e8 = local_e8 + lVar15;
      uVar27 = uVar47;
    } while (lVar38 < lVar30);
  }
  if ((int)((uint)uVar47 | 3) < max_ii) {
    uVar27 = uVar47 & 0xffffffff;
    lVar38 = lVar35 * 4;
    lVar23 = lVar38 + (uVar27 + 3 + lVar33) * lVar36 * 4;
    lVar15 = lVar36 * 0x10;
    lVar51 = lVar38 + (uVar27 + 2 + lVar33) * lVar36 * 4;
    lVar25 = lVar38 + (uVar27 + 1 + lVar33) * lVar36 * 4;
    lVar38 = lVar38 + (lVar33 + uVar27) * lVar36 * 4;
    do {
      if (0 < max_kk && iVar32 == 4) {
        pauVar22 = (undefined1 (*) [16])
                   ((long)A->data + (long)(k * 4) * 4 + (uVar27 + lVar33) * lVar36 * 4);
        iVar19 = max_kk;
        do {
          *(undefined1 (*) [16])*pauVar42 = *pauVar22;
          pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
          pauVar22 = pauVar22 + 1;
          iVar19 = iVar19 + -1;
        } while (iVar19 != 0);
      }
      if (iVar32 == 1) {
        pvVar17 = A->data;
        if (max_kk < 8) {
          uVar43 = 0;
          lVar29 = lVar35 * 4 + (uVar27 + lVar33) * lVar36 * 4;
          lVar40 = lVar35 * 4 + (uVar27 + lVar33 + 1) * lVar36 * 4;
          lVar24 = lVar35 * 4 + (uVar27 + lVar33 + 2) * lVar36 * 4;
          lVar39 = lVar35 * 4 + (uVar27 + lVar33 + 3) * lVar36 * 4;
        }
        else {
          iVar19 = 7;
          lVar29 = 0;
          pauVar16 = pauVar42;
          do {
            pauVar26 = pauVar16;
            pauVar18 = (undefined1 (*) [32])(*pauVar42 + lVar29 * 4);
            auVar54 = *(undefined1 (*) [32])((long)pvVar17 + lVar29 + lVar38);
            auVar81 = *(undefined1 (*) [32])((long)pvVar17 + lVar29 + lVar25);
            auVar82 = *(undefined1 (*) [32])((long)pvVar17 + lVar29 + lVar51);
            auVar2 = *(undefined1 (*) [32])((long)pvVar17 + lVar29 + lVar23);
            auVar3 = vunpcklps_avx(auVar54,auVar81);
            auVar81 = vunpckhps_avx(auVar54,auVar81);
            auVar54 = vunpcklps_avx(auVar82,auVar2);
            auVar82 = vunpckhps_avx(auVar82,auVar2);
            auVar2 = vunpcklpd_avx(auVar3,auVar54);
            auVar54 = vunpckhpd_avx(auVar3,auVar54);
            auVar3 = vunpcklpd_avx(auVar81,auVar82);
            auVar81 = vunpckhpd_avx(auVar81,auVar82);
            auVar82._16_16_ = auVar54._0_16_;
            auVar82._0_16_ = auVar2._0_16_;
            auVar83._16_16_ = auVar81._0_16_;
            auVar83._0_16_ = auVar3._0_16_;
            auVar54 = vperm2f128_avx(auVar2,auVar54,0x31);
            auVar81 = vperm2f128_avx(auVar3,auVar81,0x31);
            *pauVar18 = auVar82;
            pauVar18[1] = auVar83;
            pauVar18[2] = auVar54;
            pauVar18[3] = auVar81;
            lVar29 = lVar29 + 0x20;
            iVar19 = iVar19 + 8;
            pauVar16 = (undefined1 (*) [64])(pauVar18 + 4);
          } while (iVar19 < max_kk);
          pauVar42 = pauVar26 + 2;
          lVar39 = lVar29 + lVar23;
          lVar24 = lVar29 + lVar51;
          lVar40 = lVar29 + lVar25;
          lVar29 = lVar29 + lVar38;
          uVar43 = max_kk & 0xfffffff8;
        }
        lVar39 = (long)pvVar17 + lVar39;
        lVar24 = (long)pvVar17 + lVar24;
        lVar40 = (long)pvVar17 + lVar40;
        lVar29 = (long)pvVar17 + lVar29;
        if ((int)(uVar43 | 3) < max_kk) {
          lVar44 = 0;
          pauVar16 = pauVar42;
          uVar48 = uVar43;
          do {
            pauVar26 = pauVar16;
            auVar52 = vunpcklps_avx(*(undefined1 (*) [16])(lVar29 + lVar44),
                                    *(undefined1 (*) [16])(lVar40 + lVar44));
            auVar9 = vunpcklps_avx(*(undefined1 (*) [16])(lVar24 + lVar44),
                                   *(undefined1 (*) [16])(lVar39 + lVar44));
            auVar53 = vunpckhps_avx(*(undefined1 (*) [16])(lVar29 + lVar44),
                                    *(undefined1 (*) [16])(lVar40 + lVar44));
            auVar7 = vunpckhps_avx(*(undefined1 (*) [16])(lVar24 + lVar44),
                                   *(undefined1 (*) [16])(lVar39 + lVar44));
            auVar8 = vunpcklpd_avx(auVar52,auVar9);
            auVar52 = vunpckhpd_avx(auVar52,auVar9);
            auVar9 = vunpcklpd_avx(auVar53,auVar7);
            auVar53 = vunpckhpd_avx(auVar53,auVar7);
            pauVar16 = (undefined1 (*) [64])(pauVar42[1] + lVar44 * 4);
            *(undefined1 (*) [16])pauVar16[-1] = auVar8;
            *(undefined1 (*) [16])(pauVar16[-1] + 0x10) = auVar52;
            *(undefined1 (*) [16])(pauVar16[-1] + 0x20) = auVar9;
            *(undefined1 (*) [16])(pauVar16[-1] + 0x30) = auVar53;
            uVar43 = uVar48 + 4;
            lVar44 = lVar44 + 0x10;
            iVar19 = uVar48 + 7;
            uVar48 = uVar43;
          } while (iVar19 < max_kk);
          pauVar42 = pauVar26 + 1;
          lVar39 = lVar39 + lVar44;
          lVar24 = lVar24 + lVar44;
          lVar40 = lVar40 + lVar44;
          lVar29 = lVar29 + lVar44;
        }
        if ((int)uVar43 < max_kk) {
          lVar44 = 0;
          do {
            *(undefined4 *)*pauVar42 = *(undefined4 *)(lVar29 + lVar44 * 4);
            *(undefined4 *)(*pauVar42 + 4) = *(undefined4 *)(lVar40 + lVar44 * 4);
            *(undefined4 *)(*pauVar42 + 8) = *(undefined4 *)(lVar24 + lVar44 * 4);
            *(undefined4 *)(*pauVar42 + 0xc) = *(undefined4 *)(lVar39 + lVar44 * 4);
            pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
            lVar44 = lVar44 + 1;
          } while (max_kk - uVar43 != (int)lVar44);
        }
      }
      uVar47 = uVar27 + 4;
      lVar39 = uVar27 + 7;
      lVar23 = lVar23 + lVar15;
      lVar51 = lVar51 + lVar15;
      lVar25 = lVar25 + lVar15;
      lVar38 = lVar38 + lVar15;
      uVar27 = uVar47;
    } while (lVar39 < lVar30);
  }
  if ((int)((uint)uVar47 | 1) < max_ii) {
    uVar27 = (ulong)(int)(uint)uVar47;
    lVar23 = lVar35 * 4 + (uVar27 + lVar33 + 1) * lVar36 * 4;
    lVar51 = lVar35 * 4 + (uVar27 + lVar33) * lVar36 * 4;
    do {
      pvVar17 = A->data;
      if (max_kk < 8) {
        lVar38 = lVar35 * 4 + (uVar27 + lVar33) * lVar36 * 4;
        lVar25 = lVar35 * 4 + (uVar27 + lVar33 + 1) * lVar36 * 4;
        uVar43 = 0;
      }
      else {
        iVar32 = 7;
        lVar38 = 0;
        pauVar16 = pauVar42;
        do {
          pauVar26 = pauVar16;
          auVar54 = *(undefined1 (*) [32])((long)pvVar17 + lVar38 + lVar51);
          auVar81 = *(undefined1 (*) [32])((long)pvVar17 + lVar38 + lVar23);
          auVar82 = vunpcklps_avx(auVar54,auVar81);
          auVar54 = vunpckhps_avx(auVar54,auVar81);
          auVar81._16_16_ = auVar54._0_16_;
          auVar81._0_16_ = auVar82._0_16_;
          auVar54 = vperm2f128_avx(auVar82,auVar54,0x31);
          pauVar18 = (undefined1 (*) [32])(*pauVar42 + lVar38 * 2);
          *pauVar18 = auVar81;
          pauVar18[1] = auVar54;
          lVar38 = lVar38 + 0x20;
          iVar32 = iVar32 + 8;
          pauVar16 = (undefined1 (*) [64])(pauVar18 + 2);
        } while (iVar32 < max_kk);
        pauVar42 = pauVar26 + 1;
        lVar25 = lVar38 + lVar23;
        lVar38 = lVar38 + lVar51;
        uVar43 = max_kk & 0xfffffff8;
      }
      pauVar31 = (undefined1 (*) [16])((long)pvVar17 + lVar38);
      pauVar22 = (undefined1 (*) [16])((long)pvVar17 + lVar25);
      uVar48 = uVar43 | 3;
      while ((int)uVar48 < max_kk) {
        auVar53 = vunpcklps_avx(*pauVar31,*pauVar22);
        auVar52 = vunpckhps_avx(*pauVar31,*pauVar22);
        *(undefined1 (*) [16])*pauVar42 = auVar53;
        *(undefined1 (*) [16])(*pauVar42 + 0x10) = auVar52;
        pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
        pauVar31 = pauVar31 + 1;
        pauVar22 = pauVar22 + 1;
        uVar48 = uVar43 + 7;
        uVar43 = uVar43 + 4;
      }
      if ((int)uVar43 < max_kk) {
        lVar25 = 0;
        do {
          *(undefined4 *)*pauVar42 = *(undefined4 *)(*pauVar31 + lVar25 * 4);
          *(undefined4 *)(*pauVar42 + 4) = *(undefined4 *)(*pauVar22 + lVar25 * 4);
          pauVar42 = (undefined1 (*) [64])(*pauVar42 + 8);
          lVar25 = lVar25 + 1;
        } while (max_kk - uVar43 != (int)lVar25);
      }
      uVar47 = uVar27 + 2;
      lVar25 = uVar27 + 3;
      lVar23 = lVar23 + lVar36 * 8;
      lVar51 = lVar51 + lVar36 * 8;
      uVar27 = uVar47;
    } while (lVar25 < lVar30);
  }
  if ((int)uVar47 < max_ii) {
    lVar23 = (long)(int)uVar47;
    do {
      puVar28 = (undefined8 *)((long)A->data + lVar35 * 4 + (lVar23 + lVar33) * lVar36 * 4);
      if (max_kk < 8) {
        uVar43 = 0;
      }
      else {
        iVar32 = 7;
        do {
          uVar11 = puVar28[1];
          uVar12 = puVar28[2];
          uVar13 = puVar28[3];
          *(undefined8 *)*pauVar42 = *puVar28;
          *(undefined8 *)(*pauVar42 + 8) = uVar11;
          *(undefined8 *)(*pauVar42 + 0x10) = uVar12;
          *(undefined8 *)(*pauVar42 + 0x18) = uVar13;
          pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
          puVar28 = puVar28 + 4;
          iVar32 = iVar32 + 8;
          uVar43 = max_kk & 0xfffffff8;
        } while (iVar32 < max_kk);
      }
      uVar48 = uVar43 | 3;
      while ((int)uVar48 < max_kk) {
        uVar11 = puVar28[1];
        *(undefined8 *)*pauVar42 = *puVar28;
        *(undefined8 *)(*pauVar42 + 8) = uVar11;
        pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
        puVar28 = puVar28 + 2;
        uVar48 = uVar43 + 7;
        uVar43 = uVar43 + 4;
      }
      if ((int)uVar43 < max_kk) {
        lVar51 = 0;
        lVar25 = 0;
        do {
          *(undefined4 *)(*pauVar42 + lVar25 * 4) = *(undefined4 *)((long)puVar28 + lVar25 * 4);
          lVar25 = lVar25 + 1;
          lVar51 = lVar51 + -4;
        } while (max_kk - uVar43 != (int)lVar25);
        pauVar42 = (undefined1 (*) [64])((long)pauVar42 - lVar51);
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 != lVar30);
  }
  return;
}

Assistant:

static void pack_A_tile(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    const int elempack = A.elempack;
    const int A_hstep = A.dims == 3 ? (int)A.cstep : A.w;

    float* pp = AT;

    int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; ii + 15 < max_ii; ii += 16)
    {
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 16;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm512_store_ps(pp, _mm512_load_ps(p0));
                pp += 16;
                p0 += 16;
            }
        }
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 8;
            const float* p1 = (const float*)A + (i + ii + 8) * A_hstep + k * 8;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                _mm256_store_ps(pp + 8, _mm256_load_ps(p1));
                pp += 16;
                p0 += 8;
                p1 += 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 4;
            const float* p1 = (const float*)A + (i + ii + 4) * A_hstep + k * 4;
            const float* p2 = (const float*)A + (i + ii + 8) * A_hstep + k * 4;
            const float* p3 = (const float*)A + (i + ii + 12) * A_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                _mm_store_ps(pp + 8, _mm_load_ps(p2));
                _mm_store_ps(pp + 12, _mm_load_ps(p3));
                pp += 16;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
            const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
            const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;
            const float* p4 = (const float*)A + (i + ii + 4) * A_hstep + k;
            const float* p5 = (const float*)A + (i + ii + 5) * A_hstep + k;
            const float* p6 = (const float*)A + (i + ii + 6) * A_hstep + k;
            const float* p7 = (const float*)A + (i + ii + 7) * A_hstep + k;
            const float* p8 = (const float*)A + (i + ii + 8) * A_hstep + k;
            const float* p9 = (const float*)A + (i + ii + 9) * A_hstep + k;
            const float* pa = (const float*)A + (i + ii + 10) * A_hstep + k;
            const float* pb = (const float*)A + (i + ii + 11) * A_hstep + k;
            const float* pc = (const float*)A + (i + ii + 12) * A_hstep + k;
            const float* pd = (const float*)A + (i + ii + 13) * A_hstep + k;
            const float* pe = (const float*)A + (i + ii + 14) * A_hstep + k;
            const float* pf = (const float*)A + (i + ii + 15) * A_hstep + k;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_loadu_ps(p0);
                __m512 _r1 = _mm512_loadu_ps(p1);
                __m512 _r2 = _mm512_loadu_ps(p2);
                __m512 _r3 = _mm512_loadu_ps(p3);
                __m512 _r4 = _mm512_loadu_ps(p4);
                __m512 _r5 = _mm512_loadu_ps(p5);
                __m512 _r6 = _mm512_loadu_ps(p6);
                __m512 _r7 = _mm512_loadu_ps(p7);
                __m512 _r8 = _mm512_loadu_ps(p8);
                __m512 _r9 = _mm512_loadu_ps(p9);
                __m512 _ra = _mm512_loadu_ps(pa);
                __m512 _rb = _mm512_loadu_ps(pb);
                __m512 _rc = _mm512_loadu_ps(pc);
                __m512 _rd = _mm512_loadu_ps(pd);
                __m512 _re = _mm512_loadu_ps(pe);
                __m512 _rf = _mm512_loadu_ps(pf);
                transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                _mm512_store_ps(pp + 16 * 8, _r8);
                _mm512_store_ps(pp + 16 * 9, _r9);
                _mm512_store_ps(pp + 16 * 10, _ra);
                _mm512_store_ps(pp + 16 * 11, _rb);
                _mm512_store_ps(pp + 16 * 12, _rc);
                _mm512_store_ps(pp + 16 * 13, _rd);
                _mm512_store_ps(pp + 16 * 14, _re);
                _mm512_store_ps(pp + 16 * 15, _rf);
                pp += 256;
                p0 += 16;
                p1 += 16;
                p2 += 16;
                p3 += 16;
                p4 += 16;
                p5 += 16;
                p6 += 16;
                p7 += 16;
                p8 += 16;
                p9 += 16;
                pa += 16;
                pb += 16;
                pc += 16;
                pd += 16;
                pe += 16;
                pf += 16;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp[8] = p8[0];
                pp[9] = p9[0];
                pp[10] = pa[0];
                pp[11] = pb[0];
                pp[12] = pc[0];
                pp[13] = pd[0];
                pp[14] = pe[0];
                pp[15] = pf[0];
                pp += 16;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
                p8++;
                p9++;
                pa++;
                pb++;
                pc++;
                pd++;
                pe++;
                pf++;
            }
        }
    }
#endif // __AVX512F__
    for (; ii + 7 < max_ii; ii += 8)
    {
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 8;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                pp += 8;
                p0 += 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 4;
            const float* p1 = (const float*)A + (i + ii + 4) * A_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
            const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
            const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;
            const float* p4 = (const float*)A + (i + ii + 4) * A_hstep + k;
            const float* p5 = (const float*)A + (i + ii + 5) * A_hstep + k;
            const float* p6 = (const float*)A + (i + ii + 6) * A_hstep + k;
            const float* p7 = (const float*)A + (i + ii + 7) * A_hstep + k;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                __m256 _r4 = _mm256_loadu_ps(p4);
                __m256 _r5 = _mm256_loadu_ps(p5);
                __m256 _r6 = _mm256_loadu_ps(p6);
                __m256 _r7 = _mm256_loadu_ps(p7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
                p4 += 8;
                p5 += 8;
                p6 += 8;
                p7 += 8;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp += 8;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
            }
        }
    }
#endif // __AVX__
    for (; ii + 3 < max_ii; ii += 4)
    {
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
            const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
            const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                _mm256_store_ps(pp + 16, _r2);
                _mm256_store_ps(pp + 24, _r3);
                pp += 32;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r1);
                _mm_store_ps(pp + 8, _r2);
                _mm_store_ps(pp + 12, _r3);
                pp += 16;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp += 4;
                p0++;
                p1++;
                p2++;
                p3++;
            }
        }
    }
#endif // __SSE2__
    for (; ii + 1 < max_ii; ii += 2)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                transpose8x2_ps(_r0, _r1);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                pp += 16;
                p0 += 8;
                p1 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp += 2;
                p0++;
                p1++;
            }
        }
    }
    for (; ii < max_ii; ii += 1)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_storeu_ps(pp, _mm256_loadu_ps(p0));
                pp += 8;
                p0 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_storeu_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0++;
            }
        }
    }
}